

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

bool __thiscall
QTriangulator<unsigned_short>::SimpleToMonotone::edgeIsLeftOfEdge
          (SimpleToMonotone *this,int leftEdgeIndex,int rightEdgeIndex)

{
  Edge *pEVar1;
  QPodPoint *pQVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  pEVar1 = (this->m_edges).buffer;
  pQVar2 = (this->m_parent->m_vertices).buffer;
  lVar7 = (long)pQVar2[(&pEVar1[rightEdgeIndex].from)[pEVar1[rightEdgeIndex].pointingUp ^ 1]].x;
  lVar6 = (long)pQVar2[(&pEVar1[rightEdgeIndex].from)[pEVar1[rightEdgeIndex].pointingUp ^ 1]].y;
  lVar5 = pQVar2[(&pEVar1[rightEdgeIndex].from)[pEVar1[rightEdgeIndex].pointingUp]].x - lVar7;
  lVar4 = pQVar2[(&pEVar1[rightEdgeIndex].from)[pEVar1[rightEdgeIndex].pointingUp]].y - lVar6;
  lVar3 = (pQVar2[(&pEVar1[leftEdgeIndex].from)[pEVar1[leftEdgeIndex].pointingUp]].y - lVar6) *
          lVar5 - (pQVar2[(&pEVar1[leftEdgeIndex].from)[pEVar1[leftEdgeIndex].pointingUp]].x - lVar7
                  ) * lVar4;
  if (lVar3 == 0) {
    lVar3 = (pQVar2[(&pEVar1[leftEdgeIndex].from)[pEVar1[leftEdgeIndex].pointingUp ^ 1]].y - lVar6)
            * lVar5 - (pQVar2[(&pEVar1[leftEdgeIndex].from)[pEVar1[leftEdgeIndex].pointingUp ^ 1]].x
                      - lVar7) * lVar4;
  }
  return SUB81((ulong)lVar3 >> 0x3f,0);
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::edgeIsLeftOfEdge(int leftEdgeIndex, int rightEdgeIndex) const
{
    const Edge &leftEdge = m_edges.at(leftEdgeIndex);
    const Edge &rightEdge = m_edges.at(rightEdgeIndex);
    const QPodPoint &u = m_parent->m_vertices.at(rightEdge.upper());
    const QPodPoint &l = m_parent->m_vertices.at(rightEdge.lower());
    qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(m_parent->m_vertices.at(leftEdge.upper()), l, u);
    // d < 0: left, d > 0: right, d == 0: on top
    if (d == 0)
        d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(m_parent->m_vertices.at(leftEdge.lower()), l, u);
    return d < 0;
}